

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns_query_signature::parse_map_item
          (cdns_query_signature *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  bool bVar1;
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns_query_signature *this_local;
  
  bVar1 = cdns::is_old_version(this->current_block->current_cdns);
  if (bVar1) {
    in_max_local = parse_map_item_old(this,in,in_max,val,err);
  }
  else {
    switch(val) {
    case 0:
      in_max_local = cbor_parse_int(in,in_max,&this->server_address_index,0,err);
      break;
    case 1:
      in_max_local = cbor_parse_int(in,in_max,&this->server_port,0,err);
      break;
    case 2:
      in_max_local = cbor_parse_int(in,in_max,&this->qr_transport_flags,0,err);
      break;
    case 3:
      in_max_local = cbor_parse_int(in,in_max,&this->qr_type,0,err);
      break;
    case 4:
      in_max_local = cbor_parse_int(in,in_max,&this->qr_sig_flags,0,err);
      break;
    case 5:
      in_max_local = cbor_parse_int(in,in_max,&this->query_opcode,0,err);
      break;
    case 6:
      in_max_local = cbor_parse_int(in,in_max,&this->qr_dns_flags,0,err);
      break;
    case 7:
      in_max_local = cbor_parse_int(in,in_max,&this->query_rcode,0,err);
      break;
    case 8:
      in_max_local = cbor_parse_int(in,in_max,&this->query_classtype_index,0,err);
      break;
    case 9:
      in_max_local = cbor_parse_int(in,in_max,&this->query_qd_count,0,err);
      break;
    case 10:
      in_max_local = cbor_parse_int(in,in_max,&this->query_an_count,0,err);
      break;
    case 0xb:
      in_max_local = cbor_parse_int(in,in_max,&this->query_ns_count,0,err);
      break;
    case 0xc:
      in_max_local = cbor_parse_int(in,in_max,&this->query_ar_count,0,err);
      break;
    case 0xd:
      in_max_local = cbor_parse_int(in,in_max,&this->edns_version,0,err);
      break;
    case 0xe:
      in_max_local = cbor_parse_int(in,in_max,&this->udp_buf_size,0,err);
      break;
    case 0xf:
      in_max_local = cbor_parse_int(in,in_max,&this->opt_rdata_index,0,err);
      break;
    case 0x10:
      in_max_local = cbor_parse_int(in,in_max,&this->response_rcode,0,err);
      break;
    default:
      in_max_local = cbor_skip(in,in_max,err);
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns_query_signature::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    if (current_block->current_cdns->is_old_version()) {
        in = parse_map_item_old(in, in_max, val, err);
    }
    else {
        switch (val) {
        case 0: /*  server_address_index */
            in = cbor_parse_int(in, in_max, &server_address_index, 0, err);
            break;
        case 1: /*  server_port */
            in = cbor_parse_int(in, in_max, &server_port, 0, err);
            break;
        case 2: /*  transport_flags */
            in = cbor_parse_int(in, in_max, &qr_transport_flags, 0, err);
            break;
        case 3: /* qr type */
            in = cbor_parse_int(in, in_max, &qr_type, 0, err);
            break;
        case 4: /*  qr_sig_flags */
            in = cbor_parse_int(in, in_max, &qr_sig_flags, 0, err);
            break;
        case 5: /*  query_opcode */
            in = cbor_parse_int(in, in_max, &query_opcode, 0, err);
            break;
        case 6: /*  qr_dns_flags */
            in = cbor_parse_int(in, in_max, &qr_dns_flags, 0, err);
            break;
        case 7: /*  query_rcode */
            in = cbor_parse_int(in, in_max, &query_rcode, 0, err);
            break;
        case 8: /*  query_classtype_index */
            in = cbor_parse_int(in, in_max, &query_classtype_index, 0, err);
            break;
        case 9: /*  query_qd_count */
            in = cbor_parse_int(in, in_max, &query_qd_count, 0, err);
            break;
        case 10: /*  query_an_count */
            in = cbor_parse_int(in, in_max, &query_an_count, 0, err);
            break;
        case 11: /*  query_ns_count */
            in = cbor_parse_int(in, in_max, &query_ns_count, 0, err);
            break;
        case 12: /*  query_ar_count */
            in = cbor_parse_int(in, in_max, &query_ar_count, 0, err);
            break;
        case 13: /*  edns_version */
            in = cbor_parse_int(in, in_max, &edns_version, 0, err);
            break;
        case 14: /*  udp_buf_size */
            in = cbor_parse_int(in, in_max, &udp_buf_size, 0, err);
            break;
        case 15: /*  opt_rdata_index */
            in = cbor_parse_int(in, in_max, &opt_rdata_index, 0, err);
            break;
        case 16: /*  response_rcode */
            in = cbor_parse_int(in, in_max, &response_rcode, 0, err);
            break;
        default:
            in = cbor_skip(in, in_max, err);
            break;
        }
    }
    return in;
}